

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O2

void __thiscall mdsplit::mdsplitter::list_doc_outsiders(mdsplitter *this)

{
  pointer pmVar1;
  pointer pmVar2;
  pointer ppVar3;
  bool bVar4;
  bool bVar5;
  path *ppVar6;
  ostream *poVar7;
  istream *piVar8;
  byte bVar9;
  long lVar10;
  mdsection *this_00;
  mdsection *pmVar11;
  long lVar12;
  pointer this_01;
  recursive_directory_iterator __end1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  regex gen_with_mdsplit_regex;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> outsiders;
  regex ignore_end_regex;
  regex ignore_begin_regex;
  string local_298;
  smatch sm;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_258;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_248;
  path outsider;
  
  outsiders.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outsiders.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outsiders.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&ignore_begin_regex,&this->output_dir_);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_258,
                 (__shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
                  *)&ignore_begin_regex);
  ignore_end_regex._0_8_ = local_258._M_ptr;
  ignore_end_regex._8_8_ = local_258._M_refcount._M_pi;
  local_258._M_ptr = (element_type *)0x0;
  local_258._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_258);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_248,
                 (__shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
                  *)&ignore_begin_regex);
  __end1._M_dirs._M_ptr = (element_type *)0x0;
  __end1._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_248);
  bVar5 = true;
  do {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ignore_end_regex._8_8_ ==
        __end1._M_dirs._M_refcount._M_pi) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&__end1)
      ;
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)&ignore_end_regex);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)&ignore_begin_regex);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&gen_with_mdsplit_regex,
                 " *<!-- Generated with mdsplit: https://github.com/alandefreitas/mdsplit --> *",
                 0x10);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&ignore_begin_regex," *<!-- START mdsplit-ignore --> *",0x10);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&ignore_end_regex," *<!-- END mdsplit-ignore --> *",0x10);
      ppVar3 = outsiders.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_01 = outsiders.
                super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (this_01 == ppVar3) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&ignore_end_regex);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&ignore_begin_regex);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&gen_with_mdsplit_regex);
          std::
          vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
          ~vector(&outsiders);
          return;
        }
        std::filesystem::__cxx11::path::string((string *)&__end1,this_01);
        std::ifstream::ifstream(&outsider,(string *)&__end1,_S_in);
        std::__cxx11::string::~string((string *)&__end1);
        __end1._M_dirs._M_ptr = (element_type *)&local_338;
        __end1._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_338._M_local_buf[0] = '\0';
        bVar9 = 0;
        bVar5 = false;
        do {
          piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&outsider,(string *)&__end1);
          if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
          sm.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          sm._M_begin._M_current = (char *)0x0;
          sm.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          sm.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          bVar4 = is_codeblock((string *)&__end1);
          bVar9 = bVar9 ^ bVar4;
          if (bVar9 == 0) {
            bVar4 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                              ((string *)&__end1,&ignore_begin_regex,0);
            if (bVar4) {
              bVar5 = true;
              goto LAB_00122423;
            }
            bVar4 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                              ((string *)&__end1,&ignore_end_regex,0);
            if (bVar4 || bVar5) {
              bVar5 = (bool)(bVar5 & !bVar4);
              goto LAB_00122423;
            }
            bVar5 = std::
                    regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                              ((string *)&__end1,&sm,&gen_with_mdsplit_regex,0);
            if (bVar5) {
              if (this->trace_ == true) {
                poVar7 = std::operator<<((ostream *)&std::cout,
                                         "Outsider doc file generated by mdsplit: ");
                std::filesystem::__cxx11::path::string(&local_298,this_01);
                poVar7 = std::operator<<(poVar7,(string *)&local_298);
                std::endl<char,std::char_traits<char>>(poVar7);
                std::__cxx11::string::~string((string *)&local_298);
              }
              bVar4 = true;
              if (this->erase_old_mdsplit_files_ == true) {
                if (this->trace_ == true) {
                  poVar7 = std::operator<<((ostream *)&std::cout,"Removing ");
                  std::filesystem::__cxx11::path::string(&local_298,this_01);
                  poVar7 = std::operator<<(poVar7,(string *)&local_298);
                  std::endl<char,std::char_traits<char>>(poVar7);
                  std::__cxx11::string::~string((string *)&local_298);
                }
                std::filesystem::remove(this_01);
              }
            }
            else {
              bVar4 = false;
            }
            bVar5 = false;
          }
          else {
LAB_00122423:
            bVar4 = false;
          }
          std::
          _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&sm);
        } while (!bVar4);
        std::__cxx11::string::~string((string *)&__end1);
        std::ifstream::~ifstream(&outsider);
        this_01 = this_01 + 1;
      } while( true );
    }
    ppVar6 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                               ((recursive_directory_iterator *)&ignore_end_regex);
    std::filesystem::__cxx11::path::extension(&outsider,ppVar6);
    std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
              ((path *)&gen_with_mdsplit_regex,(char (*) [4])0x127238,auto_format);
    bVar4 = std::filesystem::__cxx11::operator==(&outsider,(path *)&gen_with_mdsplit_regex);
    std::filesystem::__cxx11::path::~path((path *)&gen_with_mdsplit_regex);
    std::filesystem::__cxx11::path::~path(&outsider);
    if (bVar4) {
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::relative(&outsider,ppVar6);
      std::filesystem::__cxx11::path::~path((path *)&gen_with_mdsplit_regex);
      pmVar1 = (this->sections_).
               super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
               super__Vector_impl_data._M_start;
      pmVar2 = (this->sections_).
               super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar12 = 0;
      for (lVar10 = (long)pmVar2 - (long)pmVar1 >> 9;
          ppVar6 = (path *)((long)&(pmVar1->filepath)._M_pathname._M_dataplus + lVar12), 0 < lVar10;
          lVar10 = lVar10 + -1) {
        bVar4 = std::filesystem::__cxx11::operator==(ppVar6,&outsider);
        if (bVar4) {
          this_00 = (mdsection *)((long)&pmVar1->level + lVar12);
          goto LAB_001221b2;
        }
        bVar4 = std::filesystem::__cxx11::operator==
                          ((path *)((long)&pmVar1[1].filepath._M_pathname._M_dataplus + lVar12),
                           &outsider);
        if (bVar4) {
          this_00 = (mdsection *)((long)&pmVar1[1].level + lVar12);
          goto LAB_001221b2;
        }
        bVar4 = std::filesystem::__cxx11::operator==
                          ((path *)((long)&pmVar1[2].filepath._M_pathname._M_dataplus + lVar12),
                           &outsider);
        if (bVar4) {
          this_00 = (mdsection *)((long)&pmVar1[2].level + lVar12);
          goto LAB_001221b2;
        }
        bVar4 = std::filesystem::__cxx11::operator==
                          ((path *)((long)&pmVar1[3].filepath._M_pathname._M_dataplus + lVar12),
                           &outsider);
        if (bVar4) {
          this_00 = (mdsection *)((long)&pmVar1[3].level + lVar12);
          goto LAB_001221b2;
        }
        lVar12 = lVar12 + 0x200;
      }
      lVar10 = ((long)pmVar2 - (long)pmVar1) - lVar12 >> 7;
      pmVar11 = (mdsection *)((long)&pmVar1->level + lVar12);
      if (lVar10 == 1) {
LAB_001222c5:
        bVar4 = std::filesystem::__cxx11::operator==(&pmVar11->filepath,&outsider);
        this_00 = pmVar11;
        if (!bVar4) {
          this_00 = pmVar2;
        }
      }
      else if (lVar10 == 3) {
        bVar4 = std::filesystem::__cxx11::operator==(ppVar6,&outsider);
        this_00 = pmVar11;
        if (!bVar4) {
          pmVar11 = (mdsection *)((long)&pmVar1[1].level + lVar12);
          goto LAB_001222a2;
        }
      }
      else {
        this_00 = pmVar2;
        if (lVar10 == 2) {
LAB_001222a2:
          bVar4 = std::filesystem::__cxx11::operator==(&pmVar11->filepath,&outsider);
          this_00 = pmVar11;
          if (!bVar4) {
            pmVar11 = pmVar11 + 1;
            goto LAB_001222c5;
          }
        }
      }
LAB_001221b2:
      if ((this_00 ==
           (this->sections_).
           super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         (bVar4 = mdsection::has_content(this_00,false,false), !bVar4)) {
        bVar9 = this->trace_;
        if ((bVar5) && ((bVar9 & 1) != 0)) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "\n# The following .md files were not generated by mdsplit in this run"
                                  );
          std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<((ostream *)&std::cout,"# Please make sure that is on purpose:");
          std::endl<char,std::char_traits<char>>(poVar7);
          bVar9 = this->trace_;
        }
        if ((bVar9 & 1) != 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,"Outsider doc file: ");
          poVar7 = std::operator<<(poVar7,outsider._M_pathname._M_dataplus._M_p);
          std::operator<<(poVar7,'\n');
        }
        std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
        emplace_back<std::filesystem::__cxx11::path&>
                  ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                    *)&outsiders,&outsider);
        bVar5 = false;
      }
      std::filesystem::__cxx11::path::~path(&outsider);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)&ignore_end_regex);
  } while( true );
}

Assistant:

void mdsplitter::list_doc_outsiders() {
        bool first = true;
        std::vector<fs::path> outsiders;
        for (auto &p : fs::recursive_directory_iterator(output_dir_)) {
            if (p.path().extension() == ".md") {
                fs::path outsider = fs::relative(p.path(), fs::current_path());
                auto it = std::find_if(
                    sections_.begin(), sections_.end(),
                    [&](const mdsection &s) { return s.filepath == outsider; });
                bool section_exists = it != sections_.end();
                if (!section_exists || !it->has_content()) {
                    if (first) {
                        if (trace_) {
                            std::cout << "\n# The following .md files were not "
                                         "generated by mdsplit in this run"
                                      << std::endl;
                            std::cout
                                << "# Please make sure that is on purpose:"
                                << std::endl;
                        }
                        first = false;
                    }
                    if (trace_) {
                        std::cout << "Outsider doc file: " << outsider.c_str()
                                  << '\n';
                    }
                    outsiders.emplace_back(outsider);
                }
            }
        }

        // Remove outsiders generated by mdsplit
        std::regex gen_with_mdsplit_regex{
            R"( *<!-- Generated with mdsplit: https://github.com/alandefreitas/mdsplit --> *)"};
        std::regex ignore_begin_regex{R"( *<!-- START mdsplit-ignore --> *)"};
        std::regex ignore_end_regex{R"( *<!-- END mdsplit-ignore --> *)"};

        for (const auto &outsider : outsiders) {
            std::ifstream fin(outsider.string());
            std::string current_line;
            bool inside_codeblock = false;
            bool inside_ignoreblock = false;
            while (std::getline(fin, current_line)) {
                std::smatch sm;
                if (is_codeblock(current_line)) {
                    inside_codeblock = 1 - inside_codeblock;
                }
                if (!inside_codeblock) {
                    if (std::regex_match(current_line, ignore_begin_regex)) {
                        inside_ignoreblock = true;
                        continue;
                    } else if (std::regex_match(current_line,
                                                ignore_end_regex)) {
                        inside_ignoreblock = false;
                        continue;
                    }
                    if (inside_ignoreblock) {
                        continue;
                    }

                    bool is_mdsplit_file = std::regex_search(
                        current_line, sm, gen_with_mdsplit_regex);
                    if (is_mdsplit_file) {
                        if (trace_) {
                            std::cout
                                << "Outsider doc file generated by mdsplit: "
                                << outsider.string() << std::endl;
                        }
                        if (erase_old_mdsplit_files_) {
                            if (trace_) {
                                std::cout << "Removing " << outsider.string()
                                          << std::endl;
                            }
                            fs::remove(outsider);
                        }
                        break;
                    }
                }
            }
        }
    }